

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O0

tuple<Chainstate_*,_Chainstate_*> __thiscall
validation_chainstatemanager_tests::SnapshotTestSetup::SetupSnapshot(SnapshotTestSetup *this)

{
  long lVar1;
  Chainstate *pCVar2;
  bool bVar3;
  uint uVar4;
  type pCVar5;
  CCoinsViewCache *pCVar6;
  uint256 *puVar7;
  CBlockIndex *pCVar8;
  AssumeutxoData *pAVar9;
  reference ppCVar10;
  Chainstate *pCVar11;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  tuple<Chainstate_*,_Chainstate_*> tVar12;
  char *in_stack_ffffffffffffe948;
  CChainParams *in_stack_ffffffffffffe950;
  char *in_stack_ffffffffffffe958;
  unit_test_log_t *in_stack_ffffffffffffe960;
  undefined4 in_stack_ffffffffffffe968;
  int in_stack_ffffffffffffe96c;
  Chainstate *in_stack_ffffffffffffe970;
  path *in_stack_ffffffffffffe978;
  size_t line_num;
  const_string *in_stack_ffffffffffffe980;
  const_string *file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffe988;
  unit_test_log_t *this_00;
  TestChain100Setup *in_stack_ffffffffffffe990;
  ChainstateManager *in_stack_ffffffffffffe998;
  begin *in_stack_ffffffffffffe9a0;
  unit_test_log_t *in_stack_ffffffffffffe9a8;
  size_t *local_1628;
  undefined4 in_stack_ffffffffffffea28;
  undefined4 in_stack_ffffffffffffea2c;
  CTransactionRef *txn_2;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range3_1;
  bool is_background;
  CCoinsViewCache *coinscache_1;
  Chainstate *chainstate_1;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range2_2;
  CTransactionRef *txn_1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range3;
  CCoinsViewCache *coinscache;
  Chainstate *chainstate;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range2_1;
  CBlockIndex *tip;
  optional<AssumeutxoData> *au_data;
  Chainstate *snapshot_chainstate;
  int snapshot_height;
  Chainstate *validation_chainstate;
  CTransactionRef *txn;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range2;
  CCoinsViewCache *ibd_coinscache;
  ChainstateManager *chainman;
  SnapshotTestSetup *this_local;
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [32];
  unit_test_log_t local_1180 [2];
  const_string local_1170;
  const_string local_1160 [2];
  lazy_ostream local_1140 [2];
  assertion_result local_1120 [2];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [64];
  undefined1 local_1098 [16];
  undefined1 local_1088 [64];
  undefined1 local_1048 [88];
  iterator __end3_1;
  iterator __begin3_1;
  iterator __end2_2;
  iterator __begin2_2;
  size_t coins_missing_from_background;
  size_t coins_in_background;
  size_t coins_in_active;
  size_t new_coins;
  undefined1 local_f24 [172];
  undefined1 local_e78 [16];
  undefined1 local_e68 [64];
  const_string local_e28 [2];
  lazy_ostream local_e08 [2];
  assertion_result local_de8 [2];
  iterator __end3;
  iterator __begin3;
  size_t total_coins_1;
  undefined1 local_d98 [200];
  iterator __end2_1;
  iterator __begin2_1;
  int chains_tested;
  undefined1 local_ca0 [16];
  undefined1 local_c90 [64];
  type local_c50;
  undefined1 local_c48 [16];
  undefined1 local_c38 [64];
  undefined1 local_bf8 [16];
  undefined1 local_be8 [64];
  const_string local_ba8 [2];
  lazy_ostream local_b88 [2];
  assertion_result local_b68 [2];
  const_string local_b30 [2];
  lazy_ostream local_b10 [2];
  assertion_result local_af0 [2];
  const_string local_ab8 [2];
  lazy_ostream local_a98 [2];
  assertion_result local_a78 [2];
  const_string local_a40 [2];
  lazy_ostream local_a20 [2];
  assertion_result local_a00 [2];
  const_string local_9c8 [2];
  lazy_ostream local_9a8 [2];
  assertion_result local_988 [2];
  const_string local_950 [2];
  lazy_ostream local_930 [2];
  assertion_result local_910 [2];
  const_string local_8d8 [2];
  lazy_ostream local_8b8 [2];
  assertion_result local_898 [2];
  const_string local_860 [2];
  lazy_ostream local_840 [2];
  assertion_result local_820 [2];
  const_string local_7e8 [2];
  lazy_ostream local_7c8 [2];
  assertion_result local_7a8 [2];
  const_string local_770 [2];
  lazy_ostream local_750 [2];
  assertion_result local_730 [2];
  const_string local_6f8 [2];
  lazy_ostream local_6d8 [2];
  assertion_result local_6b8 [2];
  const_string local_680 [2];
  lazy_ostream local_660 [2];
  assertion_result local_640 [2];
  undefined1 local_608 [16];
  undefined1 local_5f8 [64];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [64];
  const_string local_568 [2];
  lazy_ostream local_548 [2];
  assertion_result local_528 [2];
  iterator __end2;
  iterator __begin2;
  size_t total_coins;
  size_t initial_total_coins;
  size_t initial_size;
  const_string local_4c8 [2];
  lazy_ostream local_4a8 [2];
  assertion_result local_488 [2];
  const_string local_450 [2];
  lazy_ostream local_430 [2];
  assertion_result local_410 [2];
  const_string local_3d8 [2];
  lazy_ostream local_3b8 [2];
  assertion_result local_398 [2];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock35;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  COutPoint op_2;
  COutPoint op_1;
  uint256 loaded_snapshot_blockhash;
  path found;
  COutPoint op;
  
  local_1048._72_8_ = (_Base_ptr)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffe988,(char *)in_stack_ffffffffffffe980,
             (int)((ulong)in_stack_ffffffffffffe978 >> 0x20),(char *)in_stack_ffffffffffffe970,
             (char *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
  pCVar5 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      in_stack_ffffffffffffe958);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    ChainstateManager::IsSnapshotActive
              ((ChainstateManager *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_398,local_3b8,local_3d8,0xb9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe948);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffe988,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe980,
             (char *)in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970,
             in_stack_ffffffffffffe96c,SUB41((uint)in_stack_ffffffffffffe968 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    ChainstateManager::IsSnapshotValidated((ChainstateManager *)in_stack_ffffffffffffe958);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_410,local_430,local_450,0xbd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    ::node::FindSnapshotChainstateDir(in_stack_ffffffffffffe978);
    std::optional::operator_cast_to_bool((optional<fs::path> *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_488,local_4a8,local_4c8,0xbe,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    std::optional<fs::path>::~optional((optional<fs::path> *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffe948);
  initial_total_coins = 100;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe948);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffe988,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe980,
             (char *)in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970,
             in_stack_ffffffffffffe96c,SUB41((uint)in_stack_ffffffffffffe968 >> 0x18,0));
  ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffe958);
  pCVar6 = Chainstate::CoinsTip
                     ((Chainstate *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
  uVar4 = CCoinsViewCache::GetCacheSize((CCoinsViewCache *)in_stack_ffffffffffffe948);
  initial_size = (size_t)uVar4;
  total_coins = 0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_ffffffffffffe950);
  __end2 = std::
           vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffe950);
  while (bVar3 = __gnu_cxx::
                 operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_ffffffffffffe958,
                            (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_ffffffffffffe950), ((bVar3 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_ffffffffffffe948);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffe948);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffe948);
    COutPoint::COutPoint
              ((COutPoint *)in_stack_ffffffffffffe958,(Txid *)in_stack_ffffffffffffe950,
               (uint32_t)((ulong)in_stack_ffffffffffffe948 >> 0x20));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                 (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
                 (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
      (*(pCVar6->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])(pCVar6,&op);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe958,
                 SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                 (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe950,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                 (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
      in_stack_ffffffffffffe948 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_528,local_548,local_568,0xcd,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffe948);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffe948);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    total_coins = total_coins + 1;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_ffffffffffffe948);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe958 = "initial_total_coins";
    in_stack_ffffffffffffe950 = (CChainParams *)&initial_total_coins;
    in_stack_ffffffffffffe948 = "total_coins";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_5a8,local_5b8,0xd1,1,2,&total_coins);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe958 = "initial_total_coins";
    in_stack_ffffffffffffe950 = (CChainParams *)&initial_total_coins;
    in_stack_ffffffffffffe948 = "initial_size";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_5f8,local_608,0xd2,1,2,&initial_size);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffe948);
  ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffe958);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    CreateAndActivateUTXOSnapshot<__25_const>(in_RSI,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_640,local_660,local_680,0xd8,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffe958);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6b8,local_6d8,local_6f8,0xd9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    ChainstateManager::SnapshotBlockhash
              ((ChainstateManager *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_730,local_750,local_770,0xda,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  TestChain100Setup::mineBlocks
            (in_stack_ffffffffffffe990,(int)((ulong)in_stack_ffffffffffffe988 >> 0x20));
  initial_size = initial_size + 10;
  initial_total_coins = initial_total_coins + 10;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    CreateAndActivateUTXOSnapshot<validation_chainstatemanager_tests::SnapshotTestSetup::SetupSnapshot()::_lambda(AutoFile&,node::SnapshotMetadata&)_1_>
              (in_RSI,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7a8,local_7c8,local_7e8,0xf1,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    ::node::FindSnapshotChainstateDir(in_stack_ffffffffffffe978);
    std::optional::operator_cast_to_bool((optional<fs::path> *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_820,local_840,local_860,0xf3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    std::optional<fs::path>::~optional((optional<fs::path> *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    CreateAndActivateUTXOSnapshot<validation_chainstatemanager_tests::SnapshotTestSetup::SetupSnapshot()::_lambda(AutoFile&,node::SnapshotMetadata&)_2_>
              (in_RSI,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_898,local_8b8,local_8d8,0xf9,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    CreateAndActivateUTXOSnapshot<validation_chainstatemanager_tests::SnapshotTestSetup::SetupSnapshot()::_lambda(AutoFile&,node::SnapshotMetadata&)_3_>
              (in_RSI,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_910,local_930,local_950,0xfe,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    CreateAndActivateUTXOSnapshot<validation_chainstatemanager_tests::SnapshotTestSetup::SetupSnapshot()::_lambda(AutoFile&,node::SnapshotMetadata&)_4_>
              (in_RSI,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_988,local_9a8,local_9c8,0x103,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    CreateAndActivateUTXOSnapshot<validation_chainstatemanager_tests::SnapshotTestSetup::SetupSnapshot()::_lambda(AutoFile&,node::SnapshotMetadata&)_5_>
              (in_RSI,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a00,local_a20,local_a40,0x108,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    CreateAndActivateUTXOSnapshot<__25_const>(in_RSI,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a78,local_a98,local_ab8,0x10a,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    ::node::FindSnapshotChainstateDir(in_stack_ffffffffffffe978);
    std::optional<fs::path>::operator*((optional<fs::path> *)in_stack_ffffffffffffe948);
    fs::exists((path *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_af0,local_b10,local_b30,0x10b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    std::optional<fs::path>::~optional((optional<fs::path> *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffe958);
    std::optional<uint256>::operator->((optional<uint256> *)in_stack_ffffffffffffe948);
    base_blob<256U>::IsNull((base_blob<256U> *)in_stack_ffffffffffffe958);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b68,local_b88,local_ba8,0x10e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffe958);
    puVar7 = std::optional<uint256>::operator*((optional<uint256> *)in_stack_ffffffffffffe948);
    ChainstateManager::SnapshotBlockhash
              ((ChainstateManager *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
    in_stack_ffffffffffffe950 =
         (CChainParams *)
         std::optional<uint256>::operator*((optional<uint256> *)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe958 = "*chainman.SnapshotBlockhash()";
    in_stack_ffffffffffffe948 = "*chainman.ActiveChainstate().m_from_snapshot_blockhash";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_be8,local_bf8,0x111,1,2,puVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffe958);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe948);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffe988,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe980,
             (char *)in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970,
             in_stack_ffffffffffffe96c,SUB41((uint)in_stack_ffffffffffffe968 >> 0x18,0));
  ::node::FindSnapshotChainstateDir(in_stack_ffffffffffffe978);
  std::optional<fs::path>::operator*((optional<fs::path> *)in_stack_ffffffffffffe948);
  fs::path::path((path *)in_stack_ffffffffffffe948,(path *)0xce842c);
  std::optional<fs::path>::~optional((optional<fs::path> *)in_stack_ffffffffffffe948);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    fs::path::path((path *)in_stack_ffffffffffffe948,(path *)0xce84e4);
    ::node::ReadSnapshotBaseBlockhash
              ((path *)CONCAT44(in_stack_ffffffffffffea2c,in_stack_ffffffffffffea28));
    puVar7 = std::optional<uint256>::operator*((optional<uint256> *)in_stack_ffffffffffffe948);
    ChainstateManager::SnapshotBlockhash
              ((ChainstateManager *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
    in_stack_ffffffffffffe950 =
         (CChainParams *)
         std::optional<uint256>::operator*((optional<uint256> *)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe958 = "*chainman.SnapshotBlockhash()";
    in_stack_ffffffffffffe948 = "*node::ReadSnapshotBaseBlockhash(found)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_c38,local_c48,0x11d,1,2,puVar7);
    fs::path::~path((path *)in_stack_ffffffffffffe948);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  fs::path::~path((path *)in_stack_ffffffffffffe948);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffe948);
  Params();
  CChainParams::AssumeutxoForHeight
            (in_stack_ffffffffffffe950,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_ffffffffffffe948);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe948);
  local_c50 = pCVar5;
  pCVar8 = SetupSnapshot::anon_class_8_1_3d09f077::operator()
                     ((anon_class_8_1_3d09f077 *)
                      CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    pAVar9 = std::optional<AssumeutxoData>::operator->
                       ((optional<AssumeutxoData> *)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe950 = (CChainParams *)&pAVar9->m_chain_tx_count;
    in_stack_ffffffffffffe958 = "au_data->m_chain_tx_count";
    in_stack_ffffffffffffe948 = "tip->m_chain_tx_count";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_c90,local_ca0,0x123,1,2,&pCVar8->m_chain_tx_count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  ChainstateManager::SnapshotBlockhash
            ((ChainstateManager *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
  puVar7 = std::optional<uint256>::operator*((optional<uint256> *)in_stack_ffffffffffffe948);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(puVar7->super_base_blob<256U>).m_data._M_elems;
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 8);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x10);
  loaded_snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x18);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe948);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffe988,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe980,
             (char *)in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970,
             in_stack_ffffffffffffe96c,SUB41((uint)in_stack_ffffffffffffe968 >> 0x18,0));
  chains_tested = 0;
  ChainstateManager::GetAll(in_stack_ffffffffffffe998);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_ffffffffffffe950);
  __end2_1 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                       ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                        in_stack_ffffffffffffe950);
  while (bVar3 = __gnu_cxx::
                 operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                           ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                             *)in_stack_ffffffffffffe958,
                            (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                             *)in_stack_ffffffffffffe950), ((bVar3 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>::
    operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
               *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::log::begin::begin
              ((begin *)in_stack_ffffffffffffe958,(const_string *)in_stack_ffffffffffffe950,
               (size_t)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::operator<<
              (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0);
    boost::unit_test::unit_test_log_t::operator()
              (in_stack_ffffffffffffe960,(log_level)((ulong)in_stack_ffffffffffffe958 >> 0x20));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [19])in_stack_ffffffffffffe948);
    Chainstate::ToString_abi_cxx11_((Chainstate *)in_stack_ffffffffffffe990);
    boost::unit_test::operator<<
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]> *)
               in_stack_ffffffffffffe950,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe948);
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)in_stack_ffffffffffffe958,
               (lazy_ostream *)in_stack_ffffffffffffe950);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffe948);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe948);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>
                        *)in_stack_ffffffffffffe948);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)0xce8f29);
    pCVar6 = Chainstate::CoinsTip
                       ((Chainstate *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968))
    ;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                 (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
                 (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                 (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
      local_d98[4] = '\0';
      local_d98[5] = '\0';
      local_d98[6] = '\0';
      local_d98[7] = '\0';
      local_d98._0_4_ = CCoinsViewCache::GetCacheSize((CCoinsViewCache *)in_stack_ffffffffffffe948);
      in_stack_ffffffffffffe958 = "coinscache.GetCacheSize()";
      in_stack_ffffffffffffe950 = (CChainParams *)local_d98;
      in_stack_ffffffffffffe948 = "(unsigned int)0";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
                (local_d98 + 0x18,local_d98 + 8,0x134,1,2,local_d98 + 4);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffe948);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    total_coins_1 = 0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffe950);
    __end3 = std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_ffffffffffffe950);
    while (bVar3 = __gnu_cxx::
                   operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               *)in_stack_ffffffffffffe958,
                              (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               *)in_stack_ffffffffffffe950), ((bVar3 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                   *)in_stack_ffffffffffffe948);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffe948);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffe948);
      COutPoint::COutPoint
                ((COutPoint *)in_stack_ffffffffffffe958,(Txid *)in_stack_ffffffffffffe950,
                 (uint32_t)((ulong)in_stack_ffffffffffffe948 >> 0x20));
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                   (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
                   (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
        (*(pCVar6->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])(pCVar6,&op_1);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffe958,
                   SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                   (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffe950,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                   (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
        in_stack_ffffffffffffe948 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_de8,local_e08,local_e28,0x13a,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffe948);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffe948);
        bVar3 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar3);
      total_coins_1 = total_coins_1 + 1;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                    *)in_stack_ffffffffffffe948);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                 (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
                 (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                 (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
      local_f24._168_4_ =
           CCoinsViewCache::GetCacheSize((CCoinsViewCache *)in_stack_ffffffffffffe948);
      in_stack_ffffffffffffe958 = "coinscache.GetCacheSize()";
      in_stack_ffffffffffffe950 = (CChainParams *)(local_f24 + 0xa8);
      in_stack_ffffffffffffe948 = "initial_size";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_e68,local_e78,0x13e,1,2,&initial_size);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffe948);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                 (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
                 (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
                 (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
      in_stack_ffffffffffffe958 = "initial_total_coins";
      in_stack_ffffffffffffe950 = (CChainParams *)&initial_total_coins;
      in_stack_ffffffffffffe948 = "total_coins";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_f24 + 100,local_f24 + 0x54,0x13f,1,2,&total_coins_1);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffe948);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    chains_tested = chains_tested + 1;
    __gnu_cxx::
    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>::
    operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                *)in_stack_ffffffffffffe948);
  }
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_ffffffffffffe958);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    local_f24[0] = '\x02';
    local_f24[1] = '\0';
    local_f24[2] = '\0';
    local_f24[3] = '\0';
    in_stack_ffffffffffffe958 = "2";
    in_stack_ffffffffffffe950 = (CChainParams *)local_f24;
    in_stack_ffffffffffffe948 = "chains_tested";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_f24 + 0x14,local_f24 + 4,0x143,1,2,&chains_tested);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffe948);
  new_coins = 100;
  TestChain100Setup::mineBlocks
            (in_stack_ffffffffffffe990,(int)((ulong)in_stack_ffffffffffffe988 >> 0x20));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe948);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffe988,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffe980,
             (char *)in_stack_ffffffffffffe978,(char *)in_stack_ffffffffffffe970,
             in_stack_ffffffffffffe96c,SUB41((uint)in_stack_ffffffffffffe968 >> 0x18,0));
  coins_in_active = 0;
  coins_in_background = 0;
  coins_missing_from_background = 0;
  ChainstateManager::GetAll(in_stack_ffffffffffffe998);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_ffffffffffffe950);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_ffffffffffffe950);
  while (bVar3 = __gnu_cxx::
                 operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                           ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                             *)in_stack_ffffffffffffe958,
                            (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                             *)in_stack_ffffffffffffe950), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppCVar10 = __gnu_cxx::
               __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
               ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                            *)in_stack_ffffffffffffe948);
    pCVar2 = *ppCVar10;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::log::begin::begin
              ((begin *)in_stack_ffffffffffffe958,(const_string *)in_stack_ffffffffffffe950,
               (size_t)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::operator<<
              (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0);
    boost::unit_test::unit_test_log_t::operator()
              (in_stack_ffffffffffffe960,(log_level)((ulong)in_stack_ffffffffffffe958 >> 0x20));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [19])in_stack_ffffffffffffe948);
    Chainstate::ToString_abi_cxx11_((Chainstate *)in_stack_ffffffffffffe990);
    boost::unit_test::operator<<
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]> *)
               in_stack_ffffffffffffe950,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe948);
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)in_stack_ffffffffffffe958,
               (lazy_ostream *)in_stack_ffffffffffffe950);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_ffffffffffffe948);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe948);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[19],_const_char_(&)[19]>
                        *)in_stack_ffffffffffffe948);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)0xce9a43);
    pCVar6 = Chainstate::CoinsTip
                       ((Chainstate *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968))
    ;
    pCVar11 = ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffe958);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffe950);
    __end3_1 = std::
               vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_ffffffffffffe950);
    while (bVar3 = __gnu_cxx::
                   operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               *)in_stack_ffffffffffffe958,
                              (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               *)in_stack_ffffffffffffe950), ((bVar3 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                   *)in_stack_ffffffffffffe948);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffe948);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffe948);
      COutPoint::COutPoint
                ((COutPoint *)in_stack_ffffffffffffe958,(Txid *)in_stack_ffffffffffffe950,
                 (uint32_t)((ulong)in_stack_ffffffffffffe948 >> 0x20));
      uVar4 = (*(pCVar6->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])(pCVar6,&op_2)
      ;
      if ((uVar4 & 1) == 0) {
        if (pCVar2 != pCVar11) {
          coins_missing_from_background = coins_missing_from_background + 1;
        }
      }
      else {
        if (pCVar2 != pCVar11) {
          local_1628 = &coins_in_background;
        }
        else {
          local_1628 = &coins_in_active;
        }
        *local_1628 = *local_1628 + 1;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                    *)in_stack_ffffffffffffe948);
    }
    __gnu_cxx::
    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>::
    operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                *)in_stack_ffffffffffffe948);
  }
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_ffffffffffffe958);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    local_1048._0_8_ = initial_total_coins + 100;
    in_stack_ffffffffffffe958 = "initial_total_coins + new_coins";
    in_stack_ffffffffffffe950 = (CChainParams *)local_1048;
    in_stack_ffffffffffffe948 = "coins_in_active";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1048 + 0x18,local_1048 + 8,0x15f,1,2,&coins_in_active);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe958 = "initial_total_coins";
    in_stack_ffffffffffffe950 = (CChainParams *)&initial_total_coins;
    in_stack_ffffffffffffe948 = "coins_in_background";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1088,local_1098,0x160,1,2,&coins_in_background);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe958 = "new_coins";
    in_stack_ffffffffffffe950 = (CChainParams *)&new_coins;
    in_stack_ffffffffffffe948 = "coins_missing_from_background";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_10d8,local_10e8,0x161,1,2,&coins_missing_from_background);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffe948);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
               (size_t)in_stack_ffffffffffffe978,(const_string *)in_stack_ffffffffffffe970);
    CreateAndActivateUTXOSnapshot<__25_const>(in_RSI,0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958,
               SUB81((ulong)in_stack_ffffffffffffe950 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe948 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1120,local_1140,local_1160,0x165,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe948);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    file = &local_1170;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    this_00 = local_1180;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe948);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,line_num,(const_string *)in_stack_ffffffffffffe970);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe950,(char (*) [1])in_stack_ffffffffffffe948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958,
               (pointer)in_stack_ffffffffffffe950,(unsigned_long)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe970 =
         ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_ffffffffffffe958);
    puVar7 = std::optional<uint256>::operator*((optional<uint256> *)in_stack_ffffffffffffe948);
    in_stack_ffffffffffffe958 = "loaded_snapshot_blockhash";
    in_stack_ffffffffffffe950 = (CChainParams *)&loaded_snapshot_blockhash;
    in_stack_ffffffffffffe948 = "*chainman.ActiveChainstate().m_from_snapshot_blockhash";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_11a0,local_11b0,0x16a,1,2,puVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe948);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  tVar12 = std::make_tuple<Chainstate*,Chainstate*>
                     ((Chainstate **)in_stack_ffffffffffffe950,
                      (Chainstate **)in_stack_ffffffffffffe948);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  tVar12.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.super__Tuple_impl<1UL,_Chainstate_*>.
  super__Head_base<1UL,_Chainstate_*,_false>._M_head_impl =
       (_Head_base<1UL,_Chainstate_*,_false>)(_Head_base<1UL,_Chainstate_*,_false>)this;
  return (tuple<Chainstate_*,_Chainstate_*>)
         tVar12.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>;
}

Assistant:

std::tuple<Chainstate*, Chainstate*> SetupSnapshot()
    {
        ChainstateManager& chainman = *Assert(m_node.chainman);

        BOOST_CHECK(!chainman.IsSnapshotActive());

        {
            LOCK(::cs_main);
            BOOST_CHECK(!chainman.IsSnapshotValidated());
            BOOST_CHECK(!node::FindSnapshotChainstateDir(chainman.m_options.datadir));
        }

        size_t initial_size;
        size_t initial_total_coins{100};

        // Make some initial assertions about the contents of the chainstate.
        {
            LOCK(::cs_main);
            CCoinsViewCache& ibd_coinscache = chainman.ActiveChainstate().CoinsTip();
            initial_size = ibd_coinscache.GetCacheSize();
            size_t total_coins{0};

            for (CTransactionRef& txn : m_coinbase_txns) {
                COutPoint op{txn->GetHash(), 0};
                BOOST_CHECK(ibd_coinscache.HaveCoin(op));
                total_coins++;
            }

            BOOST_CHECK_EQUAL(total_coins, initial_total_coins);
            BOOST_CHECK_EQUAL(initial_size, initial_total_coins);
        }

        Chainstate& validation_chainstate = chainman.ActiveChainstate();

        // Snapshot should refuse to load at this height.
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(this));
        BOOST_CHECK(!chainman.ActiveChainstate().m_from_snapshot_blockhash);
        BOOST_CHECK(!chainman.SnapshotBlockhash());

        // Mine 10 more blocks, putting at us height 110 where a valid assumeutxo value can
        // be found.
        constexpr int snapshot_height = 110;
        mineBlocks(10);
        initial_size += 10;
        initial_total_coins += 10;

        // Should not load malleated snapshots
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // A UTXO is missing but count is correct
                metadata.m_coins_count -= 1;

                Txid txid;
                auto_infile >> txid;
                // coins size
                (void)ReadCompactSize(auto_infile);
                // vout index
                (void)ReadCompactSize(auto_infile);
                Coin coin;
                auto_infile >> coin;
        }));

        BOOST_CHECK(!node::FindSnapshotChainstateDir(chainman.m_options.datadir));

        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Coins count is larger than coins in file
                metadata.m_coins_count += 1;
        }));
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Coins count is smaller than coins in file
                metadata.m_coins_count -= 1;
        }));
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Wrong hash
                metadata.m_base_blockhash = uint256::ZERO;
        }));
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(
            this, [](AutoFile& auto_infile, SnapshotMetadata& metadata) {
                // Wrong hash
                metadata.m_base_blockhash = uint256::ONE;
        }));

        BOOST_REQUIRE(CreateAndActivateUTXOSnapshot(this));
        BOOST_CHECK(fs::exists(*node::FindSnapshotChainstateDir(chainman.m_options.datadir)));

        // Ensure our active chain is the snapshot chainstate.
        BOOST_CHECK(!chainman.ActiveChainstate().m_from_snapshot_blockhash->IsNull());
        BOOST_CHECK_EQUAL(
            *chainman.ActiveChainstate().m_from_snapshot_blockhash,
            *chainman.SnapshotBlockhash());

        Chainstate& snapshot_chainstate = chainman.ActiveChainstate();

        {
            LOCK(::cs_main);

            fs::path found = *node::FindSnapshotChainstateDir(chainman.m_options.datadir);

            // Note: WriteSnapshotBaseBlockhash() is implicitly tested above.
            BOOST_CHECK_EQUAL(
                *node::ReadSnapshotBaseBlockhash(found),
                *chainman.SnapshotBlockhash());
        }

        const auto& au_data = ::Params().AssumeutxoForHeight(snapshot_height);
        const CBlockIndex* tip = WITH_LOCK(chainman.GetMutex(), return chainman.ActiveTip());

        BOOST_CHECK_EQUAL(tip->m_chain_tx_count, au_data->m_chain_tx_count);

        // To be checked against later when we try loading a subsequent snapshot.
        uint256 loaded_snapshot_blockhash{*chainman.SnapshotBlockhash()};

        // Make some assertions about the both chainstates. These checks ensure the
        // legacy chainstate hasn't changed and that the newly created chainstate
        // reflects the expected content.
        {
            LOCK(::cs_main);
            int chains_tested{0};

            for (Chainstate* chainstate : chainman.GetAll()) {
                BOOST_TEST_MESSAGE("Checking coins in " << chainstate->ToString());
                CCoinsViewCache& coinscache = chainstate->CoinsTip();

                // Both caches will be empty initially.
                BOOST_CHECK_EQUAL((unsigned int)0, coinscache.GetCacheSize());

                size_t total_coins{0};

                for (CTransactionRef& txn : m_coinbase_txns) {
                    COutPoint op{txn->GetHash(), 0};
                    BOOST_CHECK(coinscache.HaveCoin(op));
                    total_coins++;
                }

                BOOST_CHECK_EQUAL(initial_size , coinscache.GetCacheSize());
                BOOST_CHECK_EQUAL(total_coins, initial_total_coins);
                chains_tested++;
            }

            BOOST_CHECK_EQUAL(chains_tested, 2);
        }

        // Mine some new blocks on top of the activated snapshot chainstate.
        constexpr size_t new_coins{100};
        mineBlocks(new_coins);  // Defined in TestChain100Setup.

        {
            LOCK(::cs_main);
            size_t coins_in_active{0};
            size_t coins_in_background{0};
            size_t coins_missing_from_background{0};

            for (Chainstate* chainstate : chainman.GetAll()) {
                BOOST_TEST_MESSAGE("Checking coins in " << chainstate->ToString());
                CCoinsViewCache& coinscache = chainstate->CoinsTip();
                bool is_background = chainstate != &chainman.ActiveChainstate();

                for (CTransactionRef& txn : m_coinbase_txns) {
                    COutPoint op{txn->GetHash(), 0};
                    if (coinscache.HaveCoin(op)) {
                        (is_background ? coins_in_background : coins_in_active)++;
                    } else if (is_background) {
                        coins_missing_from_background++;
                    }
                }
            }

            BOOST_CHECK_EQUAL(coins_in_active, initial_total_coins + new_coins);
            BOOST_CHECK_EQUAL(coins_in_background, initial_total_coins);
            BOOST_CHECK_EQUAL(coins_missing_from_background, new_coins);
        }

        // Snapshot should refuse to load after one has already loaded.
        BOOST_REQUIRE(!CreateAndActivateUTXOSnapshot(this));

        // Snapshot blockhash should be unchanged.
        BOOST_CHECK_EQUAL(
            *chainman.ActiveChainstate().m_from_snapshot_blockhash,
            loaded_snapshot_blockhash);
        return std::make_tuple(&validation_chainstate, &snapshot_chainstate);
    }